

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_SetSpecies
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  bool bVar2;
  AActor *pAVar3;
  char *pcVar4;
  
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_003f0227;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003f0217:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003f0227:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x193e,
                  "int AF_AActor_A_SetSpecies(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  pAVar3 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar3 == (AActor *)0x0) goto LAB_003f01c3;
    bVar2 = DObject::IsKindOf((DObject *)pAVar3,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003f0227;
    }
  }
  else {
    if (pAVar3 != (AActor *)0x0) goto LAB_003f0217;
LAB_003f01c3:
    pAVar3 = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar4 = "(paramnum) < numparam";
  }
  else {
    if (param[1].field_0.field_3.Type == '\0') {
      iVar1 = param[1].field_0.i;
      if ((uint)numparam < 3) {
        param = defaultparam->Array;
        if (param[2].field_0.field_3.Type == '\0') goto LAB_003f01f5;
        pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
      }
      else {
        if (param[2].field_0.field_3.Type == '\0') {
LAB_003f01f5:
          pAVar3 = COPY_AAPTR(pAVar3,param[2].field_0.i);
          if (pAVar3 != (AActor *)0x0) {
            (pAVar3->Species).super_FName.Index = iVar1;
          }
          return 0;
        }
        pcVar4 = "(param[paramnum]).Type == REGT_INT";
      }
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1940,
                    "int AF_AActor_A_SetSpecies(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar4 = "param[paramnum].Type == REGT_INT";
  }
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x193f,
                "int AF_AActor_A_SetSpecies(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetSpecies)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_NAME(species);
	PARAM_INT_DEF(ptr);

	AActor *mobj = COPY_AAPTR(self, ptr);
	if (!mobj)
	{
		return 0;
	}

	mobj->Species = species;
	return 0;
}